

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O2

bool __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::equals
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,
          QObject<std::complex<float>_> *other)

{
  bool bVar1;
  SquareMatrix<std::complex<float>_> SStack_28;
  SquareMatrix<std::complex<float>_> local_18;
  
  (*other->_vptr_QObject[7])(&local_18);
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&SStack_28,this);
  bVar1 = dense::SquareMatrix<std::complex<float>_>::operator==(&local_18,&SStack_28);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&SStack_28.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_18.data_);
  return bVar1;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
        return ( other.matrix() == matrix() ) ;
      }